

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-menu.c
# Opt level: O1

void display_menu_row(menu_conflict *menu,int pos,int top,_Bool cursor,int row,int col,int width)

{
  byte bVar1;
  uint uVar2;
  _func_int_menu_ptr_int *p_Var3;
  _func_char_menu_ptr_int *p_Var4;
  wchar_t y;
  char cVar5;
  uint uVar6;
  char *s;
  undefined7 in_register_00000009;
  int iVar7;
  _Bool local_34;
  
  y = (wchar_t)CONCAT71(in_register_00000009,cursor);
  iVar7 = pos;
  if (menu->filter_list != (int *)0x0) {
    iVar7 = menu->filter_list[pos];
  }
  uVar2 = menu->flags;
  p_Var3 = menu->row_funcs->valid_row;
  if (p_Var3 == (_func_int_menu_ptr_int *)0x0) {
    uVar6 = 1;
  }
  else {
    uVar6 = (*p_Var3)(menu,iVar7);
  }
  if (uVar6 != 2) {
    if ((uVar2 & 2) == 0) {
      if ((uVar2 & 1) == 0) {
        if ((uVar2 & 4) == 0 && menu->selections != (char *)0x0) {
          cVar5 = menu->selections[pos];
        }
        else {
          p_Var4 = menu->row_funcs->get_tag;
          if (p_Var4 == (_func_char_menu_ptr_int *)0x0) {
            cVar5 = '\0';
          }
          else {
            cVar5 = (*p_Var4)(menu,iVar7);
          }
        }
      }
      else {
        cVar5 = (*menu->skin->get_tag)(menu,pos);
      }
    }
    else {
      cVar5 = '\0';
    }
    local_34 = SUB41(top,0);
    if (cVar5 != '\0') {
      bVar1 = curs_attrs[(uVar6 & 0xfffffffd) != 0][local_34];
      s = format("%c) ",(ulong)(uint)(int)cVar5);
      Term_putstr(row,y,L'\x03',(uint)bVar1,s);
      row = row + 3;
      col = col + -3;
    }
    (*menu->row_funcs->display_row)(menu,iVar7,local_34,y,row,col);
    return;
  }
  return;
}

Assistant:

static void display_menu_row(struct menu *menu, int pos, int top,
                             bool cursor, int row, int col, int width)
{
	int flags = menu->flags;
	char sel = 0;
	int oid = pos;
	menu_row_validity_t row_valid = MN_ROW_VALID;

	if (menu->filter_list)
		oid = menu->filter_list[oid];

	if (menu->row_funcs->valid_row)
		row_valid = menu->row_funcs->valid_row(menu, oid);

	if (row_valid == MN_ROW_HIDDEN)
		return;

	if (!(flags & MN_NO_TAGS)) {
		if (flags & MN_REL_TAGS)
			sel = menu->skin->get_tag(menu, pos);
		else if (menu->selections && !(flags & MN_PVT_TAGS))
			sel = menu->selections[pos];
		else if (menu->row_funcs->get_tag)
			sel = menu->row_funcs->get_tag(menu, oid);
	}

	if (sel) {
		menu_row_style_t style = menu_row_style_for_validity(row_valid);
		uint8_t color = curs_attrs[style][0 != (cursor)];
		Term_putstr(col, row, 3, color, format("%c) ", sel));
		col += 3;
		width -= 3;
	}

	menu->row_funcs->display_row(menu, oid, cursor, row, col, width);
}